

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SkipCommentAndWhitespaceAndNewline
          (AsciiParser *this,bool allow_semicolon)

{
  bool bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  char local_1b;
  char local_1a;
  byte local_19;
  char d;
  char c;
  AsciiParser *pAStack_18;
  bool allow_semicolon_local;
  AsciiParser *this_local;
  
  local_19 = allow_semicolon;
  pAStack_18 = this;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            bVar1 = Eof(this);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              return true;
            }
            bVar1 = Char1(this,&local_1a);
            if (!bVar1) {
              return false;
            }
            if (local_1a != '#') break;
            bVar1 = SkipUntilNewline(this);
            if (!bVar1) {
              return false;
            }
          }
          if (((local_1a != ' ') && (local_1a != '\t')) && (local_1a != '\f')) break;
          (this->_curr_cursor).col = (this->_curr_cursor).col + 1;
        }
        if (((local_19 & 1) == 0) || (local_1a != ';')) break;
        (this->_curr_cursor).col = (this->_curr_cursor).col + 1;
      }
      if (local_1a != '\n') break;
      (this->_curr_cursor).col = 0;
      (this->_curr_cursor).row = (this->_curr_cursor).row + 1;
    }
    if (local_1a != '\r') {
      bVar1 = StreamReader::seek_from_current(this->_sr,-1);
      if (bVar1) {
        return true;
      }
      return false;
    }
    uVar2 = StreamReader::tell(this->_sr);
    uVar3 = StreamReader::size(this->_sr);
    if (uVar2 < uVar3 - 1) {
      bVar1 = Char1(this,&local_1b);
      if (!bVar1) {
        return false;
      }
      if ((local_1b != '\n') && (bVar1 = StreamReader::seek_from_current(this->_sr,-1), !bVar1)) {
        return false;
      }
    }
    (this->_curr_cursor).col = 0;
    (this->_curr_cursor).row = (this->_curr_cursor).row + 1;
  } while( true );
}

Assistant:

bool AsciiParser::SkipCommentAndWhitespaceAndNewline(
    const bool allow_semicolon) {
  // Skip multiple line of comments.
  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    // printf("sws c = %c\n", c);

    if (c == '#') {
      if (!SkipUntilNewline()) {
        return false;
      }
    } else if ((c == ' ') || (c == '\t') || (c == '\f')) {
      _curr_cursor.col++;
      // continue
    } else if (allow_semicolon && (c == ';')) {
      _curr_cursor.col++;
      // continue
    } else if (c == '\n') {
      _curr_cursor.col = 0;
      _curr_cursor.row++;
      // continue
    } else if (c == '\r') {
      // CRLF?
      if (_sr->tell() < (_sr->size() - 1)) {
        char d;
        if (!Char1(&d)) {
          // this should not happen.
          return false;
        }

        if (d == '\n') {
          // CRLF
        } else {
          // unwind 1 char
          if (!_sr->seek_from_current(-1)) {
            // this should not happen.
            return false;
          }
        }
      }
      _curr_cursor.col = 0;
      _curr_cursor.row++;
      // continue
    } else {
      // std::cout << "unwind\n";
      // end loop
      if (!_sr->seek_from_current(-1)) {
        return false;
      }
      break;
    }
  }

  return true;
}